

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O3

bool operator<(BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               *l,BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *r)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((string *)l);
  if (iVar1 < 0) {
    bVar2 = true;
  }
  else {
    iVar1 = std::__cxx11::string::compare((string *)r);
    if (iVar1 < 0) {
      bVar2 = false;
    }
    else {
      bVar2 = (l->Value).second < (r->Value).second;
    }
  }
  return bVar2;
}

Assistant:

bool operator<(BT<T> const& l, BT<T> const& r)
  {
    return l.Value < r.Value;
  }